

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O1

void Handlers::Init_Init(EOClient *client,PacketReader *reader)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EOServer *pEVar2;
  byte bVar3;
  uchar uVar4;
  bool bVar5;
  bool bVar6;
  pair<unsigned_char,_unsigned_char> pVar7;
  uint uVar8;
  uint uVar9;
  IPAddress IVar10;
  int iVar11;
  int iVar12;
  mapped_type *pmVar13;
  time_t tVar14;
  _List_node_base *p_Var15;
  EOClient *pEVar16;
  int iVar17;
  list<Client_*,_std::allocator<Client_*>_> *plVar18;
  int *hdid;
  double dVar19;
  IPAddress remote_addr;
  char errbuf [64];
  PacketBuilder reply;
  string hdid_str;
  IPAddress local_d4;
  EOClient *local_d0;
  key_type local_c8 [2];
  PacketBuilder local_88;
  ulong local_58;
  string local_50;
  
  PacketBuilder::PacketBuilder(&local_88,PACKET_F_INIT,PACKET_A_INIT,10);
  uVar8 = PacketReader::GetThree(reader);
  PacketReader::GetChar(reader);
  PacketReader::GetChar(reader);
  bVar3 = PacketReader::GetChar(reader);
  client->version = (uint)bVar3;
  uVar4 = PacketReader::GetChar(reader);
  bVar3 = PacketReader::GetChar(reader);
  PacketReader::GetEndString_abi_cxx11_(&local_50,reader);
  uVar9 = util::to_uint_raw(&local_50);
  client->hdid = uVar9;
  pEVar2 = (EOServer *)(client->super_Client).server;
  if (local_50._M_string_length == bVar3) {
    p_Var15 = (pEVar2->super_Server).clients.super__List_base<Client_*,_std::allocator<Client_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar18 = &(pEVar2->super_Server).clients;
    iVar17 = 0;
    local_d0 = client;
    local_58 = (ulong)uVar8;
    if (p_Var15 != (_List_node_base *)plVar18) {
      do {
        if (*(int *)&((Client *)p_Var15[1]._M_next)[1].send_buffer.field_2 == client->hdid) {
          IVar10 = Client::GetRemoteAddr((Client *)p_Var15[1]._M_next);
          local_c8[0]._M_dataplus._M_p._0_4_ = IVar10.address;
          local_d4 = Client::GetRemoteAddr(&local_d0->super_Client);
          bVar5 = IPAddress::operator==((IPAddress *)local_c8,&local_d4);
          iVar17 = iVar17 + (uint)bVar5;
        }
        p_Var15 = p_Var15->_M_next;
      } while (p_Var15 != (_List_node_base *)plVar18);
    }
    pEVar16 = local_d0;
    p_Var15 = (local_d0->super_Client).server[1].clients.
              super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
              super__List_node_base._M_prev;
    paVar1 = &local_c8[0].field_2;
    local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"IgnoreHDID","");
    pmVar13 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var15[0x19]._M_prev,local_c8);
    bVar5 = util::variant::GetBool(pmVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) {
      p_Var15 = (pEVar16->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MaxConnectionsPerPC","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var15[0x19]._M_prev,local_c8);
      iVar11 = util::variant::GetInt(pmVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if ((iVar11 != 0) && (iVar11 < iVar17)) {
        snprintf((char *)local_c8,0x40,"too many connections from this PC: %08x",
                 (ulong)(uint)pEVar16->hdid);
        pEVar2 = (EOServer *)(pEVar16->super_Client).server;
        local_d4 = Client::GetRemoteAddr(&pEVar16->super_Client);
        EOServer::RecordClientRejection(pEVar2,&local_d4,(char *)local_c8);
        Client::Close(&pEVar16->super_Client,true);
        goto LAB_0016056f;
      }
    }
    local_d4 = Client::GetRemoteAddr(&pEVar16->super_Client);
    hdid = &client->hdid;
    if (bVar5) {
      hdid = (int *)0x0;
    }
    iVar17 = World::CheckBan((World *)(pEVar16->super_Client).server[1].clients.
                                      super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                      _M_node.super__List_node_base._M_prev,(string *)0x0,&local_d4,
                             hdid);
    if (iVar17 == -1) {
      p_Var15 = (pEVar16->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MinVersion","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var15[0x19]._M_prev,local_c8);
      iVar17 = util::variant::GetInt(pmVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if (iVar17 == 0) {
        p_Var15 = (pEVar16->super_Client).server[1].clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_prev;
        local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"OldVersionCompat","");
        pmVar13 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var15[0x19]._M_prev,local_c8);
        bVar5 = util::variant::GetBool(pmVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1
                         );
        }
        iVar17 = 0x1c - (uint)bVar5;
        pEVar16 = local_d0;
      }
      p_Var15 = (pEVar16->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"MaxVersion","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var15[0x19]._M_prev,local_c8);
      iVar11 = util::variant::GetInt(pmVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      if (pEVar16->version < iVar17) {
        bVar5 = false;
      }
      else {
        iVar12 = 0x1c;
        if (iVar11 != 0) {
          iVar12 = iVar11;
        }
        bVar5 = pEVar16->version <= iVar12 || iVar12 < 0;
      }
      p_Var15 = (local_d0->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      local_c8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CheckVersion","");
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var15[0x19]._M_prev,local_c8);
      bVar6 = util::variant::GetBool(pmVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8[0]._M_dataplus._M_p,local_c8[0].field_2._M_allocated_capacity + 1);
      }
      pEVar16 = local_d0;
      if ((bVar6 & (bVar5 ^ 1U | uVar4 != 'p')) == 0) {
        iVar17 = (int)local_58;
        uVar8 = iVar17 + 1;
        iVar11 = util::rand();
        iVar12 = util::rand();
        EOClient::InitNewSequence(pEVar16);
        pVar7 = EOClient::GetSeqInitBytes(pEVar16);
        PacketBuilder::AddByte(&local_88,'\x02');
        PacketBuilder::AddByte(&local_88,pVar7.first);
        PacketBuilder::AddByte(&local_88,pVar7.second);
        PacketBuilder::AddByte(&local_88,(uchar)iVar11);
        PacketBuilder::AddByte(&local_88,(uchar)iVar12);
        PacketBuilder::AddShort(&local_88,pEVar16->id);
        PacketBuilder::AddThree
                  (&local_88,
                   ((0xa94023U - iVar17) %
                   (((iVar17 - (uVar8 / 0xb + (uVar8 / 0xb) * 10)) + 1) * 0x77 + 0x77)) *
                   (((uVar8 / 9) * -9 + (int)local_58 + 1) * 0x77 + 0x77) +
                   (uVar8 / 0x7d4) * -0x7d4 + (int)local_58 + 0x1b13a);
        PacketProcessor::SetEMulti(&pEVar16->processor,(uchar)iVar11,(uchar)iVar12);
        EOClient::Send(pEVar16,&local_88);
        pEVar16->state = Initialized;
      }
      else {
        pEVar2 = (EOServer *)(local_d0->super_Client).server;
        IVar10 = Client::GetRemoteAddr(&local_d0->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar10.address;
        EOServer::RecordClientRejection(pEVar2,(IPAddress *)local_c8,"out of date");
        PacketBuilder::AddByte(&local_88,'\x01');
        PacketBuilder::AddChar(&local_88,0);
        PacketBuilder::AddChar(&local_88,0);
        PacketBuilder::AddChar(&local_88,iVar17);
        EOClient::Send(pEVar16,&local_88);
        Client::Close(&pEVar16->super_Client,false);
      }
    }
    else {
      PacketBuilder::AddByte(&local_88,'\x03');
      pEVar2 = (EOServer *)(pEVar16->super_Client).server;
      if (iVar17 == 0) {
        IVar10 = Client::GetRemoteAddr(&pEVar16->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar10.address;
        EOServer::RecordClientRejection(pEVar2,(IPAddress *)local_c8,"perm ban");
        PacketBuilder::AddByte(&local_88,'\x02');
      }
      else {
        IVar10 = Client::GetRemoteAddr(&pEVar16->super_Client);
        local_c8[0]._M_dataplus._M_p._0_4_ = IVar10.address;
        EOServer::RecordClientRejection(pEVar2,(IPAddress *)local_c8,"temp ban");
        tVar14 = time((time_t *)0x0);
        PacketBuilder::AddByte(&local_88,'\0');
        dVar19 = ceil((double)(iVar17 - tVar14) / 60.0);
        if (255.0 <= dVar19) {
          dVar19 = 255.0;
        }
        PacketBuilder::AddByte(&local_88,(uchar)(int)dVar19);
      }
      EOClient::Send(pEVar16,&local_88);
      Client::Close(&pEVar16->super_Client,false);
    }
  }
  else {
    IVar10 = Client::GetRemoteAddr(&client->super_Client);
    local_c8[0]._M_dataplus._M_p._0_4_ = IVar10.address;
    EOServer::RecordClientRejection(pEVar2,(IPAddress *)local_c8,"bad hdid");
    Client::Close(&client->super_Client,true);
  }
LAB_0016056f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::~PacketBuilder(&local_88);
  return;
}

Assistant:

void Init_Init(EOClient *client, PacketReader &reader)
{
	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 10);

	unsigned int challenge;
	unsigned int response;

	challenge = reader.GetThree();

	reader.GetChar(); // ?
	reader.GetChar(); // ?
	client->version = reader.GetChar();
	unsigned prot = reader.GetChar();
	unsigned hdid_len = reader.GetChar();
	std::string hdid_str = reader.GetEndString();

	try
	{
		client->hdid = int(util::to_uint_raw(hdid_str));
	}
	catch (std::invalid_argument&)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	if (hdid_str.length() != hdid_len)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	int pc_connections = 0;

	UTIL_FOREACH(client->server()->clients, checkclient)
	{
		EOClient *checkeoclient = static_cast<EOClient *>(checkclient);

		if (checkeoclient->hdid == client->hdid && checkeoclient->GetRemoteAddr() == client->GetRemoteAddr())
		{
			++pc_connections;
		}
	}

	const bool ignore_hdid = client->server()->world->config["IgnoreHDID"];

	if (!ignore_hdid)
	{
		const int max_per_pc = int(client->server()->world->config["MaxConnectionsPerPC"]);

		if (max_per_pc != 0 && pc_connections > max_per_pc)
		{
			char errbuf[64];
			std::snprintf(errbuf, sizeof errbuf, "too many connections from this PC: %08x", client->hdid);
			client->server()->RecordClientRejection(client->GetRemoteAddr(), errbuf);
			client->Close(true);
			return;
		}
	}

	int ban_expires;
	IPAddress remote_addr = client->GetRemoteAddr();
	if ((ban_expires = client->server()->world->CheckBan(0, &remote_addr, ignore_hdid ? 0 : &client->hdid)) != -1)
	{
		reply.AddByte(INIT_BANNED);
		if (ban_expires == 0)
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "perm ban");
			reply.AddByte(INIT_BAN_PERM);
		}
		else
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "temp ban");
			int mins_remaining = int(std::min(255.0, std::ceil(double(ban_expires - std::time(0)) / 60.0)));
			reply.AddByte(INIT_BAN_TEMP);
			reply.AddByte(mins_remaining);
		}
		client->Send(reply);
		client->Close();
		return;
	}

	int minversion = client->server()->world->config["MinVersion"];
	if (!minversion)
	{
		minversion = client->server()->world->config["OldVersionCompat"] ? 27 : 28;
	}

	int maxversion = client->server()->world->config["MaxVersion"];
	if (!maxversion)
	{
		maxversion = 28;
	}

	bool accepted_version = client->version >= minversion && (maxversion < 0 || client->version <= maxversion);

	if (prot != 112)
		accepted_version = false;

	if (client->server()->world->config["CheckVersion"] && !accepted_version)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "out of date");
		reply.AddByte(INIT_OUT_OF_DATE);
		reply.AddChar(0);
		reply.AddChar(0);
		reply.AddChar(minversion);
		client->Send(reply);
		client->Close();
		return;
	}

	response = stupid_hash(challenge);

	int emulti_e = util::rand(6,12);
	int emulti_d = util::rand(6,12);

	client->InitNewSequence();
	auto seq_bytes = client->GetSeqInitBytes();

	reply.AddByte(INIT_OK);
	reply.AddByte(seq_bytes.first);
	reply.AddByte(seq_bytes.second);
	reply.AddByte(emulti_e);
	reply.AddByte(emulti_d);
	reply.AddShort(client->id);
	reply.AddThree(response);

	client->processor.SetEMulti(emulti_e, emulti_d);

	client->Send(reply);

	client->state = EOClient::Initialized;

	return;
}